

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::work_thread::details::
work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>::body
          (work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>
           *this)

{
  bool bVar1;
  status_t sVar2;
  extraction_result_t local_6c;
  undefined1 local_68 [4];
  extraction_result_t result;
  demand_container_t demands;
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
  *this_local;
  
  demands.super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)query_current_thread_id();
  *(_Map_pointer *)(this + 0x78) =
       demands.
       super__Deque_base<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::deque
            ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *)local_68)
  ;
  local_6c = no_demands;
  while (sVar2 = std::atomic::operator_cast_to_status_t((atomic *)(this + 8)), sVar2 == working) {
    bVar1 = std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::empty
                      ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *
                       )local_68);
    if (bVar1) {
      local_6c = demand_queue_details::
                 queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                 ::pop((queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t>
                        *)(this + 0x10),(demand_container_t *)local_68,
                       (demands_counter_t *)(this + 0x80));
    }
    if (local_6c == demand_extracted) {
      no_activity_tracking_impl_t::serve_demands_block
                ((no_activity_tracking_impl_t *)this,(demand_container_t *)local_68);
    }
  }
  std::deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_>::~deque
            ((deque<so_5::execution_demand_t,_std::allocator<so_5::execution_demand_t>_> *)local_68)
  ;
  return;
}

Assistant:

void
	body()
	{
		// Store current thread ID to attribute to avoid thread ID
		// request on every event execution.
		this->m_thread_id = so_5::query_current_thread_id();

		// Local demands queue.
		demand_container_t demands;

		auto result = extraction_result_t::no_demands;

		while( status_t::working == this->m_status )
		{
			// If the local queue is empty then we should try
			// to get new demands.
			if( demands.empty() )
				result = this->m_queue.pop( demands, this->m_demands_count );

			// Serve demands if any.
			if( extraction_result_t::demand_extracted == result )
				this->serve_demands_block( demands );
		}
	}